

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.h
# Opt level: O2

bool __thiscall Complex::operator<(Complex *this,Complex *a)

{
  bool bVar1;
  pair<Rational,_Rational> pStack_118;
  pair<Rational,_Rational> local_98;
  
  std::pair<Rational,_Rational>::pair<Rational,_Rational,_true>(&pStack_118,&this->_re,&this->_im);
  std::pair<Rational,_Rational>::pair<Rational,_Rational,_true>(&local_98,&a->_re,&a->_im);
  bVar1 = std::operator<(&pStack_118,&local_98);
  std::pair<Rational,_Rational>::~pair(&local_98);
  std::pair<Rational,_Rational>::~pair(&pStack_118);
  return bVar1;
}

Assistant:

bool operator<(const Complex &a) const
    {
        return std::make_pair(_re, _im) < std::make_pair(a._re, a._im);
    }